

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::TerminatedEvent>::construct
          (BasicTypeInfo<dap::TerminatedEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::TerminatedEvent> *this_local;
  
  memset(ptr,0,0x40);
  TerminatedEvent::TerminatedEvent((TerminatedEvent *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }